

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O3

X509V3_EXT_METHOD * X509V3_EXT_get_nid(int nid)

{
  int iVar1;
  undefined8 *puVar2;
  X509V3_EXT_METHOD *pXVar3;
  size_t idx;
  X509V3_EXT_METHOD *t;
  X509V3_EXT_METHOD tmp;
  size_t local_78;
  int *local_70;
  int local_68 [26];
  
  local_70 = local_68;
  if (-1 < nid) {
    local_68[0] = nid;
    puVar2 = (undefined8 *)bsearch(&local_70,standard_exts,0x1f,8,ext_cmp);
    if (puVar2 != (undefined8 *)0x0) {
      return (X509V3_EXT_METHOD *)*puVar2;
    }
    if ((ext_list != (stack_st_X509V3_EXT_METHOD *)0x0) &&
       (iVar1 = OPENSSL_sk_find((OPENSSL_STACK *)ext_list,&local_78,local_68,
                                sk_X509V3_EXT_METHOD_call_cmp_func), iVar1 != 0)) {
      pXVar3 = (X509V3_EXT_METHOD *)OPENSSL_sk_value((OPENSSL_STACK *)ext_list,local_78);
      return pXVar3;
    }
  }
  return (X509V3_EXT_METHOD *)0x0;
}

Assistant:

const X509V3_EXT_METHOD *X509V3_EXT_get_nid(int nid) {
  X509V3_EXT_METHOD tmp;
  const X509V3_EXT_METHOD *t = &tmp, *const * ret;
  size_t idx;

  if (nid < 0) {
    return NULL;
  }
  tmp.ext_nid = nid;
  ret = reinterpret_cast<X509V3_EXT_METHOD **>(
      bsearch(&t, standard_exts, STANDARD_EXTENSION_COUNT,
              sizeof(X509V3_EXT_METHOD *), ext_cmp));
  if (ret) {
    return *ret;
  }
  if (!ext_list) {
    return NULL;
  }

  if (!sk_X509V3_EXT_METHOD_find(ext_list, &idx, &tmp)) {
    return NULL;
  }
  return sk_X509V3_EXT_METHOD_value(ext_list, idx);
}